

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O1

QRect qt_rect_intersect_normalized(QRect *r1,QRect *r2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QRect QVar6;
  
  iVar1 = (r1->x1).m_i;
  iVar2 = (r1->y1).m_i;
  iVar3 = (r2->x1).m_i;
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  iVar1 = (r1->x2).m_i;
  iVar4 = (r2->x2).m_i;
  if (iVar1 < iVar4) {
    iVar4 = iVar1;
  }
  iVar1 = (r2->y1).m_i;
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = (r1->y2).m_i;
  iVar5 = (r2->y2).m_i;
  if (iVar2 < iVar5) {
    iVar5 = iVar2;
  }
  QVar6.y1.m_i = iVar1;
  QVar6.x1.m_i = iVar3;
  QVar6.y2.m_i = iVar5;
  QVar6.x2.m_i = iVar4;
  return QVar6;
}

Assistant:

constexpr Int value() const noexcept { return m_i; }